

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

void outputUString(UChar *s,int32_t len,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  UChar UVar1;
  int local_34;
  UChar c;
  int32_t i;
  int32_t indent_local;
  int32_t capacity_local;
  int32_t *outIx_local;
  char *outBuf_local;
  int32_t len_local;
  UChar *s_local;
  
  if (s == (UChar *)0x0) {
    outputString((char *)0x0,outBuf,outIx,capacity,indent);
  }
  else {
    for (local_34 = 0; local_34 < len || len == -1; local_34 = local_34 + 1) {
      UVar1 = s[local_34];
      outputHexBytes((ulong)(ushort)UVar1,4,outBuf,outIx,capacity);
      outputChar(' ',outBuf,outIx,capacity,indent);
      if ((len == -1) && (UVar1 == L'\0')) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void outputUString(const UChar *s, int32_t len, 
                          char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i = 0;
    UChar   c;
    if (s==NULL) {
        outputString(NULL, outBuf, outIx, capacity, indent);
        return;
    }

    for (i=0; i<len || len==-1; i++) {
        c = s[i];
        outputHexBytes(c, 4, outBuf, outIx, capacity);
        outputChar(' ', outBuf, outIx, capacity, indent);
        if (len == -1 && c==0) {
            break;
        }
    }
}